

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.hpp
# Opt level: O3

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
ImageT<float,_4U>::getSFloat
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          ImageT<float,_4U> *this,uint32_t numChannels,uint32_t targetBits)

{
  uint uVar1;
  pointer puVar2;
  char cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16_t outValue;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  ushort local_50;
  allocator_type local_4d;
  uint local_4c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  uint local_3c;
  ulong local_38;
  
  local_48 = __return_storage_ptr__;
  if (4 < numChannels) {
    __assert_fail("numChannels <= componentCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38e,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  if ((targetBits != 0x10) && (targetBits != 0x20)) {
    __assert_fail("targetBits == 16 || targetBits == 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./image.hpp"
                  ,0x38f,
                  "virtual std::vector<uint8_t> ImageT<float, 4>::getSFloat(uint32_t, uint32_t) const [componentType = float, componentCount = 4]"
                 );
  }
  uVar5 = targetBits >> 3;
  local_4c = numChannels;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,
             (ulong)(uVar5 * numChannels * (this->super_Image).height * (this->super_Image).width),
             &local_4d);
  uVar6 = (this->super_Image).height;
  if (uVar6 != 0) {
    local_38 = (ulong)uVar5;
    uVar1 = (this->super_Image).width;
    uVar12 = (ulong)local_4c;
    uVar10 = 0;
    uVar7 = local_4c;
    local_3c = uVar5;
    uVar9 = uVar1;
    do {
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        uVar6 = 0;
        do {
          if (uVar7 != 0) {
            puVar2 = (local_48->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar11 = 0;
            do {
              uVar9 = (this->super_Image).width * uVar10 + uVar6;
              uVar1 = *(uint *)((long)&this->pixels[uVar9].field_0 + uVar11 * 4);
              if (targetBits == 0x10) {
                uVar4 = uVar1 >> 0x17;
                cVar3 = (char)uVar4;
                if (cVar3 == '\0') {
                  local_50 = 0;
                }
                else {
                  uVar8 = uVar4 & 0xff;
                  if (uVar8 == 0xff) {
                    local_50 = ((uVar1 & 0x7fffff) != 0 | 0x3e) << 9;
                  }
                  else {
                    local_50 = 0x7c00;
                    if (uVar8 < 0x8f) {
                      if (uVar8 < 0x71) {
                        if (uVar8 < 0x66) {
                          local_50 = 0;
                          goto LAB_0017af30;
                        }
                        uVar4 = uVar1 & 0x7fffff | 0x800000;
                        local_50 = (ushort)(uVar4 >> (0x7eU - cVar3 & 0x1f));
                        uVar4 = uVar4 >> ((byte)(0x7d - cVar3) & 0x1f);
                      }
                      else {
                        local_50 = ((ushort)(uVar1 >> 0xd) & 0x3ff | (ushort)((uVar4 & 0x1f) << 10))
                                   ^ 0x4000;
                        uVar4 = uVar1 >> 0xc;
                      }
                      local_50 = local_50 + ((uVar4 & 1) != 0);
                    }
LAB_0017af30:
                    local_50 = local_50 & 0x7fff;
                  }
                }
                local_50 = local_50 | (ushort)(uVar1 >> 0x10) & 0x8000;
                memcpy(puVar2 + (uVar9 * uVar7 + (int)uVar11) * uVar5,&local_50,local_38);
                puVar2 = (local_48->
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                uVar7 = local_4c;
                uVar5 = local_3c;
              }
              else if (targetBits == 0x20) {
                *(uint *)(puVar2 + (uVar9 * uVar7 + (int)uVar11) * uVar5) = uVar1;
              }
              uVar11 = uVar11 + 1;
            } while (uVar12 != uVar11);
            uVar1 = (this->super_Image).width;
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 < uVar1);
        uVar6 = (this->super_Image).height;
        uVar9 = uVar1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 < uVar6);
  }
  return local_48;
}

Assistant:

virtual std::vector<uint8_t> getSFloat(uint32_t numChannels, uint32_t targetBits) const override {
        assert(numChannels <= componentCount);
        assert(targetBits == 16 || targetBits == 32);

        const uint32_t targetBytes = targetBits / 8;
        std::vector<uint8_t> data(height * width * numChannels * targetBytes);

        for (uint32_t y = 0; y < height; ++y) {
            for (uint32_t x = 0; x < width; ++x) {
                for (uint32_t c = 0; c < numChannels; ++c) {
                    const auto value = c < componentCount ? pixels[y * width + x][c] : (c != 3 ? componentType{0} : componentType{1});
                    auto* target = data.data() + (y * width * numChannels + x * numChannels + c) * targetBytes;

                    if (sizeof(componentType) == targetBytes) {
                        *reinterpret_cast<componentType*>(target) = value;
                    } else if (targetBytes == 2) {
                        const auto outValue = imageio::float_to_half(static_cast<float>(value));
                        std::memcpy(target, &outValue, targetBytes);
                    } else if (targetBytes == 4) {
                        const auto outValue = static_cast<float>(value);
                        std::memcpy(target, &outValue, targetBytes);
                    }
                }
            }
        }

        return data;
    }